

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

OPJ_BOOL opj_tcd_encode_tile(opj_tcd_t *p_tcd,OPJ_UINT32 p_tile_no,OPJ_BYTE *p_dest,
                            OPJ_UINT32 *p_data_written,OPJ_UINT32 p_max_length,
                            opj_codestream_info_t *p_cstr_info,opj_tcd_marker_info_t *p_marker_info,
                            opj_event_mgr_t *p_manager)

{
  uint uVar1;
  J2K_QUALITY_LAYER_ALLOCATION_STRATEGY JVar2;
  opj_tccp_t *poVar3;
  opj_tile_info_t *poVar4;
  opj_tcd_tile_t *poVar5;
  OPJ_INT32 *pOVar6;
  opj_cp_t *p_cp;
  opj_image_comp_t *poVar7;
  opj_tcd_resolution_t *poVar8;
  opj_tcd_precinct_t *poVar9;
  opj_tcd_cblk_enc_t *poVar10;
  opj_tcd_pass_t *poVar11;
  double thresh;
  int iVar12;
  bool bVar13;
  bool bVar14;
  OPJ_BOOL OVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  opj_packet_info_t *poVar19;
  opj_tcp_t *poVar20;
  OPJ_BYTE **pData;
  OPJ_FLOAT64 *mct_norms;
  double *pdVar21;
  opj_t2_t *p_t2;
  uint uVar22;
  uint uVar23;
  opj_tcd_tilecomp_t *poVar24;
  ulong uVar25;
  opj_tcd_tilecomp_t *poVar26;
  int iVar27;
  OPJ_UINT32 *pOVar28;
  opj_tccp_t *poVar29;
  int *piVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  OPJ_UINT32 OVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  OPJ_INT32 (*paOVar40) [3];
  OPJ_SIZE_T OVar41;
  OPJ_INT32 **ppOVar42;
  opj_tcd_tile_t *l_tile;
  OPJ_SIZE_T OVar43;
  ulong uVar44;
  float fVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  OPJ_FLOAT64 OVar48;
  double dVar49;
  double dVar50;
  undefined8 uVar51;
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double dVar56;
  double dVar57;
  double dVar58;
  undefined8 uVar59;
  double dVar60;
  OPJ_UINT32 local_580;
  undefined4 local_578;
  undefined4 uStack_574;
  double local_548;
  double local_538;
  OPJ_UINT32 local_51c;
  OPJ_BYTE *local_518;
  opj_tcd_tilecomp_t *local_510;
  opj_tcd_tilecomp_t *local_508;
  OPJ_UINT32 *local_500;
  opj_tcd_tile_t *tcd_tile;
  opj_tcd_tilecomp_t *local_4f0;
  OPJ_INT32 matrice [10] [10] [3];
  
  local_518 = p_dest;
  if (p_tcd->cur_tp_num == 0) {
    p_tcd->tcd_tileno = p_tile_no;
    poVar20 = p_tcd->cp->tcps + p_tile_no;
    p_tcd->tcp = poVar20;
    local_500 = p_data_written;
    if (p_cstr_info == (opj_codestream_info_t *)0x0) {
LAB_00141f06:
      poVar5 = p_tcd->tcd_image->tiles;
      poVar3 = poVar20->tccps;
      OVar34 = poVar5->numcomps;
      uVar33 = 0;
      poVar26 = poVar5->comps;
      poVar24 = poVar26;
      poVar29 = poVar3;
      if (OVar34 != 0) {
        do {
          pOVar6 = poVar24->data;
          lVar38 = (long)(poVar24->y1 - poVar24->y0) * (long)(poVar24->x1 - poVar24->x0);
          if (poVar29->qmfbid == 1) {
            if (lVar38 != 0) {
              lVar36 = 0;
              do {
                pOVar6[lVar36] = pOVar6[lVar36] - poVar29->m_dc_level_shift;
                lVar36 = lVar36 + 1;
              } while (lVar38 - lVar36 != 0);
              OVar34 = poVar5->numcomps;
            }
          }
          else if (lVar38 != 0) {
            iVar16 = poVar29->m_dc_level_shift;
            lVar36 = 0;
            do {
              pOVar6[lVar36] = (OPJ_INT32)(float)(pOVar6[lVar36] - iVar16);
              lVar36 = lVar36 + 1;
            } while (lVar38 - lVar36 != 0);
          }
          uVar22 = (int)uVar33 + 1;
          uVar33 = (ulong)uVar22;
          poVar24 = poVar24 + 1;
          poVar29 = poVar29 + 1;
        } while (uVar22 < OVar34);
        uVar33 = (ulong)OVar34 << 3;
      }
      if (poVar20->mct != 0) {
        OVar43 = ((long)poVar26->y1 - (long)poVar26->y0) * ((long)poVar26->x1 - (long)poVar26->x0);
        if (poVar20->mct == 2) {
          if (poVar20->m_mct_coding_matrix != (OPJ_FLOAT32 *)0x0) {
            pData = (OPJ_BYTE **)opj_malloc(uVar33);
            if (pData == (OPJ_BYTE **)0x0) {
              return 0;
            }
            uVar22 = poVar5->numcomps;
            if ((ulong)uVar22 != 0) {
              ppOVar42 = &poVar26->data;
              uVar33 = 0;
              do {
                pData[uVar33] = (OPJ_BYTE *)*ppOVar42;
                uVar33 = uVar33 + 1;
                ppOVar42 = ppOVar42 + 0xe;
              } while (uVar22 != uVar33);
            }
            OVar15 = opj_mct_encode_custom
                               ((OPJ_BYTE *)p_tcd->tcp->m_mct_coding_matrix,OVar43,pData,uVar22,
                                p_tcd->image->comps->sgnd);
            opj_free(pData);
            if (OVar15 == 0) {
              return 0;
            }
          }
        }
        else if (poVar3->qmfbid == 0) {
          opj_mct_encode_real((OPJ_FLOAT32 *)poVar26->data,(OPJ_FLOAT32 *)poVar26[1].data,
                              (OPJ_FLOAT32 *)poVar26[2].data,OVar43);
        }
        else {
          opj_mct_encode(poVar26->data,poVar26[1].data,poVar26[2].data,OVar43);
        }
      }
      poVar20 = p_tcd->tcp;
      poVar5 = p_tcd->tcd_image->tiles;
      if (poVar5->numcomps != 0) {
        poVar26 = poVar5->comps;
        pOVar28 = &poVar20->tccps->qmfbid;
        uVar22 = 0;
        do {
          if (*pOVar28 == 0) {
            iVar16 = opj_dwt_encode_real(p_tcd,poVar26);
LAB_001420fe:
            if (iVar16 == 0) goto LAB_00142d67;
          }
          else if (*pOVar28 == 1) {
            iVar16 = opj_dwt_encode(p_tcd,poVar26);
            goto LAB_001420fe;
          }
          poVar26 = poVar26 + 1;
          uVar22 = uVar22 + 1;
          pOVar28 = pOVar28 + 0x10e;
        } while (uVar22 < poVar5->numcomps);
        poVar20 = p_tcd->tcp;
      }
      if (poVar20->mct == 1) {
        if (poVar20->tccps->qmfbid == 0) {
          mct_norms = opj_mct_get_mct_norms_real();
        }
        else {
          mct_norms = opj_mct_get_mct_norms();
        }
        OVar34 = 3;
      }
      else {
        OVar34 = p_tcd->image->numcomps;
        mct_norms = poVar20->mct_norms;
      }
      OVar15 = opj_t1_encode_cblks(p_tcd,p_tcd->tcd_image->tiles,poVar20,mct_norms,OVar34);
      if (OVar15 != 0) {
        p_cp = p_tcd->cp;
        local_51c = 0;
        if (p_cstr_info != (opj_codestream_info_t *)0x0) {
          p_cstr_info->index_write = 0;
        }
        if ((p_cp->m_specific_param).m_enc.m_quality_layer_alloc_strategy < FIXED_LAYER) {
          poVar20 = p_tcd->tcp;
          poVar5 = p_tcd->tcd_image->tiles;
          poVar5->numpix = 0;
          uVar22 = poVar5->numcomps;
          if ((ulong)uVar22 == 0) {
            OVar43 = 0;
            dVar56 = 1.79769313486232e+308;
            local_548 = 0.0;
            dVar60 = 0.0;
          }
          else {
            local_510 = poVar5->comps;
            poVar7 = p_tcd->image->comps;
            dVar60 = 0.0;
            dVar56 = 1.79769313486232e+308;
            OVar43 = 0;
            uVar33 = 0;
            local_548 = 0.0;
            do {
              local_510[uVar33].numpix = 0;
              uVar1 = local_510[uVar33].numresolutions;
              if ((ulong)uVar1 == 0) {
                dVar49 = 0.0;
              }
              else {
                poVar8 = local_510[uVar33].resolutions;
                OVar41 = 0;
                uVar35 = 0;
                do {
                  uVar23 = poVar8[uVar35].numbands;
                  if ((ulong)uVar23 != 0) {
                    uVar25 = 0;
                    do {
                      if (((poVar8[uVar35].bands[uVar25].x1 != poVar8[uVar35].bands[uVar25].x0) &&
                          (poVar8[uVar35].bands[uVar25].y1 != poVar8[uVar35].bands[uVar25].y0)) &&
                         (uVar31 = poVar8[uVar35].ph * poVar8[uVar35].pw, uVar31 != 0)) {
                        poVar9 = poVar8[uVar35].bands[uVar25].precincts;
                        uVar37 = 0;
                        do {
                          uVar32 = poVar9[uVar37].ch * poVar9[uVar37].cw;
                          if (uVar32 != 0) {
                            uVar39 = 0;
                            do {
                              poVar10 = poVar9[uVar37].cblks.enc;
                              if ((ulong)poVar10[uVar39].totalpasses != 0) {
                                poVar11 = poVar10[uVar39].passes;
                                lVar38 = 0;
                                dVar49 = dVar60;
                                do {
                                  iVar16 = *(int *)((long)&poVar11->rate + lVar38);
                                  if (lVar38 == 0) {
                                    OVar48 = poVar11->distortiondec;
                                  }
                                  else {
                                    iVar16 = iVar16 - *(int *)((long)&poVar11[-1].rate + lVar38);
                                    OVar48 = (OPJ_FLOAT64)
                                             (*(double *)((long)&poVar11->distortiondec + lVar38) -
                                             *(double *)((long)poVar11 + lVar38 + -0x10));
                                  }
                                  dVar60 = dVar49;
                                  if (iVar16 != 0) {
                                    dVar60 = (double)OVar48 / (double)iVar16;
                                    dVar52 = dVar60;
                                    if (dVar56 <= dVar60) {
                                      dVar52 = dVar56;
                                    }
                                    dVar56 = dVar52;
                                    if (dVar60 <= dVar49) {
                                      dVar60 = dVar49;
                                    }
                                  }
                                  lVar38 = lVar38 + 0x18;
                                  dVar49 = dVar60;
                                } while ((ulong)poVar10[uVar39].totalpasses * 0x18 != lVar38);
                              }
                              lVar38 = (long)((poVar10[uVar39].y1 - poVar10[uVar39].y0) *
                                             (poVar10[uVar39].x1 - poVar10[uVar39].x0));
                              OVar43 = OVar43 + lVar38;
                              poVar5->numpix = OVar43;
                              OVar41 = OVar41 + lVar38;
                              local_510[uVar33].numpix = OVar41;
                              uVar39 = uVar39 + 1;
                            } while (uVar39 != uVar32);
                          }
                          uVar37 = uVar37 + 1;
                        } while (uVar37 != uVar31);
                      }
                      uVar25 = uVar25 + 1;
                    } while (uVar25 != uVar23);
                  }
                  uVar35 = uVar35 + 1;
                } while (uVar35 != uVar1);
                auVar53._8_4_ = (int)(OVar41 >> 0x20);
                auVar53._0_8_ = OVar41;
                auVar53._12_4_ = 0x45300000;
                dVar49 = (auVar53._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)OVar41) - 4503599627370496.0);
              }
              dVar52 = (double)(1 << ((byte)poVar7[uVar33].prec & 0x1f)) + -1.0;
              local_548 = local_548 + dVar52 * dVar52 * dVar49;
              uVar33 = uVar33 + 1;
            } while (uVar33 != uVar22);
          }
          if (p_cstr_info != (opj_codestream_info_t *)0x0) {
            poVar4 = p_cstr_info->tile;
            uVar22 = p_tcd->tcd_tileno;
            poVar4[uVar22].numpix = (int)OVar43;
            poVar4[uVar22].distotile = (double)(int)(double)poVar5->distotile;
            pdVar21 = (double *)opj_malloc((ulong)poVar20->numlayers << 3);
            poVar4[uVar22].thresh = pdVar21;
            if (pdVar21 == (double *)0x0) goto LAB_00142d67;
          }
          p_data_written = local_500;
          if (poVar20->numlayers != 0) {
            uVar33 = 0;
            do {
              local_580 = p_max_length;
              if (0.0 < (float)poVar20->rates[uVar33]) {
                fVar45 = ceilf((float)poVar20->rates[uVar33]);
                local_580 = (OPJ_UINT32)(long)fVar45;
                if (p_max_length <= local_580) {
                  local_580 = p_max_length;
                }
              }
              dVar49 = (double)poVar5->distotile;
              dVar52 = pow(10.0,(double)((float)poVar20->distoratio[uVar33] / 10.0));
              JVar2 = (p_cp->m_specific_param).m_enc.m_quality_layer_alloc_strategy;
              OVar34 = (OPJ_UINT32)uVar33;
              if (JVar2 == FIXED_DISTORTION_RATIO) {
                fVar45 = (float)poVar20->distoratio[uVar33];
joined_r0x00142978:
                uStack_574 = 0xbff00000;
                local_578 = 0;
                if (0.0 < fVar45) {
                  p_t2 = opj_t2_create(p_tcd->image,p_cp);
                  if (p_t2 == (opj_t2_t *)0x0) goto LAB_00142d67;
                  bVar13 = false;
                  iVar16 = 0x80;
                  local_538 = 0.0;
                  uVar59 = 0;
                  auVar54._8_8_ = 0;
                  auVar54._0_8_ = dVar56;
                  dVar50 = 0.0;
                  dVar57 = dVar60;
                  do {
                    uVar46 = (undefined4)uVar59;
                    uVar47 = (undefined4)((ulong)uVar59 >> 0x20);
                    auVar55._0_8_ = auVar54._0_8_;
                    thresh = (dVar57 + auVar55._0_8_) * 0.5;
                    if (ABS(thresh - dVar50) <= dVar50 * 5e-06) break;
                    auVar54._8_4_ = uVar46;
                    auVar54._0_8_ = thresh;
                    auVar54._12_4_ = uVar47;
                    OVar15 = opj_tcd_makelayer((opj_tcd_t *)p_tcd->tcd_image->tiles,OVar34,
                                               (OPJ_FLOAT64)thresh,0);
                    uVar51 = auVar54._8_8_;
                    dVar58 = dVar57;
                    dVar50 = local_538;
                    if ((p_cp->m_specific_param).m_enc.m_quality_layer_alloc_strategy ==
                        FIXED_DISTORTION_RATIO) {
                      if ((ushort)((short)*(int *)p_cp - 3U) < 4 ||
                          (*(int *)p_cp - 0x400U & 0xffff) < 0x59c) {
                        OVar15 = opj_t2_encode_packets
                                           (p_t2,p_tcd->tcd_tileno,poVar5,OVar34 + 1,local_518,
                                            &local_51c,local_580,p_cstr_info,
                                            (opj_tcd_marker_info_t *)0x0,p_tcd->cur_tp_num,
                                            p_tcd->tp_pos,p_tcd->cur_pino,THRESH_CALC,p_manager);
                        if (OVar15 == 0) goto LAB_00142c1f;
                        if (uVar33 == 0) {
                          OVar48 = poVar5->distolayer[0];
                        }
                        else {
                          OVar48 = (OPJ_FLOAT64)
                                   (*(double *)(matrice[0][0] + (ulong)(OVar34 - 1) * 2) +
                                   (double)poVar5->distolayer[uVar33]);
                        }
                      }
                      else if (uVar33 == 0) {
                        OVar48 = poVar5->distolayer[0];
                      }
                      else {
                        OVar48 = (OPJ_FLOAT64)
                                 (*(double *)(matrice[0][0] + (ulong)(OVar34 - 1) * 2) +
                                 (double)poVar5->distolayer[uVar33]);
                      }
                      auVar55._8_8_ = 0;
                      auVar54 = auVar55;
                      dVar58 = thresh;
                      uVar59 = uVar51;
                      uVar51 = 0;
                      dVar50 = thresh;
                      auVar55._0_8_ = thresh;
                      bVar14 = bVar13;
                      if (dVar49 - local_548 / dVar52 <= (double)OVar48) goto LAB_00142c78;
                    }
                    else {
                      bVar14 = !bVar13;
                      bVar13 = false;
                      if (bVar14 && (iVar16 != 0x80 && OVar15 != 0)) {
LAB_00142c1f:
                        uVar59 = 0;
                        bVar14 = bVar13;
                      }
                      else {
                        bVar13 = true;
                        dVar57 = thresh;
                        local_538 = thresh;
                        if (iVar16 != 0x80 && OVar15 != 0) {
                          uVar46 = 0;
                          uVar47 = 0;
                        }
                        else {
                          OVar15 = opj_t2_encode_packets
                                             (p_t2,p_tcd->tcd_tileno,poVar5,OVar34 + 1,local_518,
                                              &local_51c,local_580,p_cstr_info,
                                              (opj_tcd_marker_info_t *)0x0,p_tcd->cur_tp_num,
                                              p_tcd->tp_pos,p_tcd->cur_pino,THRESH_CALC,p_manager);
                          uVar46 = 0;
                          uVar47 = 0;
                          uVar59 = 0;
                          bVar14 = false;
                          if (OVar15 == 0) goto LAB_00142c8c;
                        }
LAB_00142c78:
                        uVar59 = uVar51;
                        auVar54._12_4_ = uVar47;
                        auVar54._8_4_ = uVar46;
                        auVar54._0_8_ = auVar55._0_8_;
                        dVar58 = dVar57;
                        dVar50 = local_538;
                        bVar14 = bVar13;
                      }
                    }
LAB_00142c8c:
                    bVar13 = bVar14;
                    local_538 = dVar50;
                    iVar16 = iVar16 + -1;
                    dVar50 = thresh;
                    dVar57 = dVar58;
                  } while (iVar16 != 0);
                  uVar35 = ~-(ulong)(local_538 == 0.0) & (ulong)local_538 |
                           (ulong)dVar50 & -(ulong)(local_538 == 0.0);
                  opj_t2_destroy(p_t2);
                  local_578 = (undefined4)uVar35;
                  uStack_574 = (undefined4)(uVar35 >> 0x20);
                }
              }
              else {
                local_578 = 0;
                uStack_574 = 0xbff00000;
                if (JVar2 == RATE_DISTORTION_RATIO) {
                  fVar45 = (float)poVar20->rates[uVar33];
                  goto joined_r0x00142978;
                }
              }
              if (p_cstr_info != (opj_codestream_info_t *)0x0) {
                p_cstr_info->tile[p_tcd->tcd_tileno].thresh[uVar33] =
                     (double)CONCAT44(uStack_574,local_578);
              }
              opj_tcd_makelayer((opj_tcd_t *)p_tcd->tcd_image->tiles,OVar34,
                                (OPJ_FLOAT64)CONCAT44(uStack_574,local_578),1);
              if (uVar33 == 0) {
                OVar48 = poVar5->distolayer[0];
              }
              else {
                OVar48 = (OPJ_FLOAT64)
                         (*(double *)(matrice[-1][9] + uVar33 * 2 + 1) +
                         (double)poVar5->distolayer[uVar33]);
              }
              *(OPJ_FLOAT64 *)(matrice[0][0] + uVar33 * 2) = OVar48;
              uVar33 = uVar33 + 1;
              p_data_written = local_500;
            } while (uVar33 < poVar20->numlayers);
          }
        }
        else {
          uVar33 = (ulong)p_tcd->tcp->numlayers;
          p_data_written = local_500;
          if (uVar33 != 0) {
            tcd_tile = p_tcd->tcd_image->tiles;
            local_508 = (opj_tcd_tilecomp_t *)(ulong)tcd_tile->numcomps;
            uVar35 = 0;
            do {
              if (local_508 != (opj_tcd_tilecomp_t *)0x0) {
                local_4f0 = tcd_tile->comps;
                poVar26 = (opj_tcd_tilecomp_t *)0x0;
                do {
                  local_510 = poVar26;
                  uVar22 = local_4f0[(long)local_510].numresolutions;
                  uVar25 = (ulong)uVar22;
                  uVar37 = 0;
LAB_0014251d:
                  do {
                    if (uVar25 == 0) goto LAB_001425b8;
                    pOVar6 = (p_cp->m_specific_param).m_enc.m_matrice;
                    uVar1 = p_tcd->image->comps[(long)local_510].prec;
                    paOVar40 = matrice[uVar37];
                    iVar16 = uVar22 * 3 * (int)uVar37;
                    uVar39 = 0;
                    do {
                      lVar38 = 0;
                      do {
                        (*(OPJ_INT32 (*) [3])*paOVar40)[lVar38] =
                             (int)((float)pOVar6[(uint)(iVar16 + (int)lVar38)] *
                                  (float)((double)uVar1 * 0.0625));
                        lVar38 = lVar38 + 1;
                      } while (lVar38 != 3);
                      uVar39 = uVar39 + 1;
                      paOVar40 = paOVar40 + 1;
                      iVar16 = iVar16 + 3;
                    } while (uVar39 != uVar25);
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != uVar33);
                  poVar8 = local_4f0[(long)local_510].resolutions;
                  uVar37 = 0;
                  do {
                    uVar22 = poVar8[uVar37].numbands;
                    if ((ulong)uVar22 != 0) {
                      uVar39 = 0;
                      do {
                        if (((poVar8[uVar37].bands[uVar39].x1 != poVar8[uVar37].bands[uVar39].x0) &&
                            (poVar8[uVar37].bands[uVar39].y1 != poVar8[uVar37].bands[uVar39].y0)) &&
                           (uVar23 = poVar8[uVar37].ph * poVar8[uVar37].pw, uVar23 != 0)) {
                          poVar9 = poVar8[uVar37].bands[uVar39].precincts;
                          uVar44 = 0;
                          do {
                            uVar31 = poVar9[uVar44].ch * poVar9[uVar44].cw;
                            if (uVar31 != 0) {
                              iVar16 = matrice[uVar35][uVar37][uVar39];
                              lVar38 = 0;
                              do {
                                poVar10 = poVar9[uVar44].cblks.enc;
                                iVar17 = uVar1 - *(int *)((long)&poVar10->numbps + lVar38);
                                if (uVar35 == 0) {
                                  iVar27 = iVar16 - iVar17;
                                  if (iVar16 - iVar17 == 0 || iVar16 < iVar17) {
                                    iVar27 = 0;
                                  }
                                  *(undefined4 *)((long)&poVar10->numpassesinlayers + lVar38) = 0;
                                }
                                else {
                                  iVar18 = matrice[(int)uVar35 - 1][uVar37][uVar39];
                                  iVar27 = iVar16 - iVar18;
                                  if ((iVar18 - iVar17 == 0 || iVar18 < iVar17) &&
                                     (iVar27 = (iVar18 - iVar17) + (iVar16 - iVar18), iVar27 < 1)) {
                                    iVar27 = 0;
                                  }
                                }
                                piVar30 = (int *)(uVar35 * 0x18 +
                                                 *(long *)((long)&poVar10->layers + lVar38));
                                iVar17 = *(int *)((long)&poVar10->numpassesinlayers + lVar38);
                                if (iVar17 == 0) {
                                  iVar18 = iVar27 * 3 + -2;
                                  if (iVar27 != 0) {
                                    iVar27 = iVar18;
                                  }
                                  *piVar30 = iVar27;
                                  if (iVar27 != 0) {
                                    piVar30[1] = *(int *)(*(long *)((long)&poVar10->passes + lVar38)
                                                         + (ulong)(iVar27 - 1) * 0x18);
                                    lVar36 = *(long *)((long)&poVar10->data + lVar38);
                                    goto LAB_00142792;
                                  }
                                }
                                else {
                                  iVar12 = iVar27 * 3;
                                  *piVar30 = iVar12;
                                  if (iVar27 != 0) {
                                    lVar36 = *(long *)((long)&poVar10->passes + lVar38);
                                    iVar18 = iVar12 + iVar17;
                                    uVar32 = *(uint *)(lVar36 + (ulong)(iVar17 - 1) * 0x18);
                                    piVar30[1] = *(int *)(lVar36 + (ulong)((iVar12 + iVar17) - 1) *
                                                                   0x18) - uVar32;
                                    lVar36 = (ulong)uVar32 +
                                             *(long *)((long)&poVar10->data + lVar38);
LAB_00142792:
                                    *(long *)(piVar30 + 4) = lVar36;
                                    *(int *)((long)&poVar10->numpassesinlayers + lVar38) = iVar18;
                                  }
                                }
                                lVar38 = lVar38 + 0x40;
                              } while ((ulong)uVar31 << 6 != lVar38);
                            }
                            uVar44 = uVar44 + 1;
                          } while (uVar44 != uVar23);
                        }
                        uVar39 = uVar39 + 1;
                      } while (uVar39 != uVar22);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != uVar25);
LAB_001427de:
                  poVar26 = (opj_tcd_tilecomp_t *)((long)&local_510->x0 + 1);
                  if (poVar26 == local_508) break;
                } while( true );
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar33);
          }
        }
        goto LAB_00141dce;
      }
    }
    else {
      poVar26 = p_tcd->tcd_image->tiles->comps;
      uVar33 = 0;
      if (poVar26->numresolutions != 0) {
        poVar3 = poVar20->tccps;
        poVar4 = p_cstr_info->tile;
        pOVar28 = &poVar26->resolutions->pw;
        uVar35 = 0;
        do {
          poVar4[p_tile_no].pw[uVar35] = *pOVar28;
          OVar34 = pOVar28[1];
          poVar4[p_tile_no].ph[uVar35] = OVar34;
          uVar22 = (int)uVar33 + OVar34 * *pOVar28;
          uVar33 = (ulong)uVar22;
          poVar4[p_tile_no].pdx[uVar35] = poVar3->prcw[uVar35];
          poVar4[p_tile_no].pdy[uVar35] = poVar3->prch[uVar35];
          uVar35 = uVar35 + 1;
          pOVar28 = pOVar28 + 0x30;
        } while (uVar35 < poVar26->numresolutions);
        uVar33 = (ulong)uVar22;
      }
      poVar19 = (opj_packet_info_t *)
                opj_calloc((long)p_cstr_info->numlayers * (long)p_cstr_info->numcomps * uVar33,0x20)
      ;
      p_cstr_info->tile[p_tile_no].packet = poVar19;
      if (poVar19 != (opj_packet_info_t *)0x0) {
        poVar20 = p_tcd->tcp;
        goto LAB_00141f06;
      }
    }
LAB_00142d67:
    OVar15 = 0;
  }
  else {
LAB_00141dce:
    if (p_cstr_info == (opj_codestream_info_t *)0x0) {
      p_cstr_info = (opj_codestream_info_t *)0x0;
    }
    else {
      p_cstr_info->index_write = 1;
    }
    OVar15 = opj_tcd_t2_encode(p_tcd,local_518,p_data_written,p_max_length,p_cstr_info,p_marker_info
                               ,p_manager);
  }
  return OVar15;
LAB_001425b8:
  uVar37 = uVar37 + 1;
  if (uVar37 == uVar33) goto LAB_001427de;
  goto LAB_0014251d;
}

Assistant:

OPJ_BOOL opj_tcd_encode_tile(opj_tcd_t *p_tcd,
                             OPJ_UINT32 p_tile_no,
                             OPJ_BYTE *p_dest,
                             OPJ_UINT32 * p_data_written,
                             OPJ_UINT32 p_max_length,
                             opj_codestream_info_t *p_cstr_info,
                             opj_tcd_marker_info_t* p_marker_info,
                             opj_event_mgr_t *p_manager)
{

    if (p_tcd->cur_tp_num == 0) {

        p_tcd->tcd_tileno = p_tile_no;
        p_tcd->tcp = &p_tcd->cp->tcps[p_tile_no];

        /* INDEX >> "Precinct_nb_X et Precinct_nb_Y" */
        if (p_cstr_info)  {
            OPJ_UINT32 l_num_packs = 0;
            OPJ_UINT32 i;
            opj_tcd_tilecomp_t *l_tilec_idx =
                &p_tcd->tcd_image->tiles->comps[0];        /* based on component 0 */
            opj_tccp_t *l_tccp = p_tcd->tcp->tccps; /* based on component 0 */

            for (i = 0; i < l_tilec_idx->numresolutions; i++) {
                opj_tcd_resolution_t *l_res_idx = &l_tilec_idx->resolutions[i];

                p_cstr_info->tile[p_tile_no].pw[i] = (int)l_res_idx->pw;
                p_cstr_info->tile[p_tile_no].ph[i] = (int)l_res_idx->ph;

                l_num_packs += l_res_idx->pw * l_res_idx->ph;
                p_cstr_info->tile[p_tile_no].pdx[i] = (int)l_tccp->prcw[i];
                p_cstr_info->tile[p_tile_no].pdy[i] = (int)l_tccp->prch[i];
            }
            p_cstr_info->tile[p_tile_no].packet = (opj_packet_info_t*) opj_calloc((
                    OPJ_SIZE_T)p_cstr_info->numcomps * (OPJ_SIZE_T)p_cstr_info->numlayers *
                                                  l_num_packs,
                                                  sizeof(opj_packet_info_t));
            if (!p_cstr_info->tile[p_tile_no].packet) {
                /* FIXME event manager error callback */
                return OPJ_FALSE;
            }
        }
        /* << INDEX */

        /* FIXME _ProfStart(PGROUP_DC_SHIFT); */
        /*---------------TILE-------------------*/
        if (! opj_tcd_dc_level_shift_encode(p_tcd)) {
            return OPJ_FALSE;
        }
        /* FIXME _ProfStop(PGROUP_DC_SHIFT); */

        /* FIXME _ProfStart(PGROUP_MCT); */
        if (! opj_tcd_mct_encode(p_tcd)) {
            return OPJ_FALSE;
        }
        /* FIXME _ProfStop(PGROUP_MCT); */

        /* FIXME _ProfStart(PGROUP_DWT); */
        if (! opj_tcd_dwt_encode(p_tcd)) {
            return OPJ_FALSE;
        }
        /* FIXME  _ProfStop(PGROUP_DWT); */

        /* FIXME  _ProfStart(PGROUP_T1); */
        if (! opj_tcd_t1_encode(p_tcd)) {
            return OPJ_FALSE;
        }
        /* FIXME _ProfStop(PGROUP_T1); */

        /* FIXME _ProfStart(PGROUP_RATE); */
        if (! opj_tcd_rate_allocate_encode(p_tcd, p_dest, p_max_length,
                                           p_cstr_info, p_manager)) {
            return OPJ_FALSE;
        }
        /* FIXME _ProfStop(PGROUP_RATE); */

    }
    /*--------------TIER2------------------*/

    /* INDEX */
    if (p_cstr_info) {
        p_cstr_info->index_write = 1;
    }
    /* FIXME _ProfStart(PGROUP_T2); */

    if (! opj_tcd_t2_encode(p_tcd, p_dest, p_data_written, p_max_length,
                            p_cstr_info, p_marker_info, p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_T2); */

    /*---------------CLEAN-------------------*/

    return OPJ_TRUE;
}